

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O1

string * base64_decode(string *__return_storage_ptr__,string *encoded_string)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  uchar char_array_4 [4];
  uchar char_array_3 [3];
  byte local_47 [4];
  byte local_43;
  byte local_42;
  char local_41;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  string *local_38;
  
  iVar4 = (int)encoded_string->_M_string_length;
  local_40 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_40;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_38 = encoded_string;
  if (iVar4 == 0) {
    iVar5 = 0;
  }
  else {
    lVar6 = 0;
    iVar5 = 0;
    do {
      bVar1 = (local_38->_M_dataplus)._M_p[lVar6];
      if ((bVar1 == 0x3d) ||
         ((iVar2 = isalnum((uint)bVar1), (bVar1 & 0xfb) != 0x2b && (iVar2 == 0)))) break;
      lVar3 = (long)iVar5;
      iVar5 = iVar5 + 1;
      local_47[lVar3] = bVar1;
      if (iVar5 == 4) {
        lVar3 = 0;
        do {
          bVar1 = std::__cxx11::string::find(-0x80,(ulong)(uint)(int)(char)local_47[lVar3]);
          local_47[lVar3] = bVar1;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 4);
        local_43 = local_47[1] >> 4 & 3 | local_47[0] << 2;
        local_42 = local_47[2] >> 2 & 0xf | local_47[1] << 4;
        local_41 = local_47[2] * '@' + local_47[3];
        lVar3 = 0;
        do {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        iVar5 = 0;
      }
      iVar4 = iVar4 + -1;
      lVar6 = lVar6 + 1;
    } while (iVar4 != 0);
  }
  if (iVar5 != 0) {
    if (iVar5 < 4) {
      memset(local_47 + iVar5,0,(ulong)(3 - iVar5) + 1);
    }
    lVar6 = 0;
    do {
      bVar1 = std::__cxx11::string::find(-0x80,(ulong)(uint)(int)(char)local_47[lVar6]);
      local_47[lVar6] = bVar1;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    local_43 = local_47[1] >> 4 & 3 | local_47[0] << 2;
    local_42 = local_47[2] >> 2 & 0xf | local_47[1] << 4;
    local_41 = local_47[2] * '@' + local_47[3];
    if (1 < iVar5) {
      uVar7 = 0;
      do {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        uVar7 = uVar7 + 1;
      } while (iVar5 - 1 != uVar7);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string base64_decode(std::string const& encoded_string) {
  int in_len = encoded_string.size();
  int i = 0;
  int j = 0;
  int in_ = 0;
  unsigned char char_array_4[4], char_array_3[3];
  std::string ret;

  while (in_len-- && ( encoded_string[in_] != '=') && is_base64(encoded_string[in_])) {
    char_array_4[i++] = encoded_string[in_]; in_++;
    if (i ==4) {
      for (i = 0; i <4; i++)
        char_array_4[i] = base64_chars.find(char_array_4[i]);

      char_array_3[0] = (char_array_4[0] << 2) + ((char_array_4[1] & 0x30) >> 4);
      char_array_3[1] = ((char_array_4[1] & 0xf) << 4) + ((char_array_4[2] & 0x3c) >> 2);
      char_array_3[2] = ((char_array_4[2] & 0x3) << 6) + char_array_4[3];

      for (i = 0; (i < 3); i++)
        ret += char_array_3[i];
      i = 0;
    }
  }

  if (i) {
    for (j = i; j <4; j++)
      char_array_4[j] = 0;

    for (j = 0; j <4; j++)
      char_array_4[j] = base64_chars.find(char_array_4[j]);

    char_array_3[0] = (char_array_4[0] << 2) + ((char_array_4[1] & 0x30) >> 4);
    char_array_3[1] = ((char_array_4[1] & 0xf) << 4) + ((char_array_4[2] & 0x3c) >> 2);
    char_array_3[2] = ((char_array_4[2] & 0x3) << 6) + char_array_4[3];

    for (j = 0; (j < i - 1); j++) ret += char_array_3[j];
  }

  return ret;
}